

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** correctgraylist(GCObject **p)

{
  GCObject *o;
  GCObject *pGVar1;
  GCObject **next;
  GCObject *curr;
  GCObject **p_local;
  
  pGVar1 = (GCObject *)p;
LAB_00115e9c:
  while( true ) {
    curr = pGVar1;
    o = curr->next;
    if (o == (GCObject *)0x0) {
      return &curr->next;
    }
    pGVar1 = (GCObject *)getgclist(o);
    if ((o->marked & 0x18) != 0) break;
    if ((o->marked & 7) != 5) goto LAB_00115f07;
    o->marked = o->marked | 0x20;
    o->marked = o->marked & 0xf8 | 6;
  }
  goto LAB_00115f4b;
LAB_00115f07:
  if (o->tt != '\b') {
    if ((o->marked & 7) == 6) {
      o->marked = o->marked & 0xf8 | 4;
    }
    o->marked = o->marked | 0x20;
LAB_00115f4b:
    curr->next = pGVar1->next;
    pGVar1 = curr;
  }
  goto LAB_00115e9c;
}

Assistant:

static GCObject **correctgraylist (GCObject **p) {
  GCObject *curr;
  while ((curr = *p) != NULL) {
    GCObject **next = getgclist(curr);
    if (iswhite(curr))
      goto remove;  /* remove all white objects */
    else if (getage(curr) == G_TOUCHED1) {  /* touched in this cycle? */
      lua_assert(isgray(curr));
      nw2black(curr);  /* make it black, for next barrier */
      setage(curr, G_TOUCHED2);
      goto remain;  /* keep it in the list and go to next element */
    }
    else if (curr->tt == LUA_VTHREAD) {
      lua_assert(isgray(curr));
      goto remain;  /* keep non-white threads on the list */
    }
    else {  /* everything else is removed */
      lua_assert(isold(curr));  /* young objects should be white here */
      if (getage(curr) == G_TOUCHED2)  /* advance from TOUCHED2... */
        setage(curr, G_OLD);  /* ... to OLD */
      nw2black(curr);  /* make object black (to be removed) */
      goto remove;
    }
    remove: *p = *next; continue;
    remain: p = next; continue;
  }
  return p;
}